

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  _Rb_tree_node_base *p_Var1;
  FILE *__stream;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  Message *pMVar5;
  _Rb_tree_node_base *p_Var6;
  char *pcVar7;
  char *names;
  char *pcVar8;
  Message errors;
  String name;
  set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
  tests;
  Message local_a0;
  String local_98;
  TypedTestCasePState *local_88;
  int local_7c;
  char *local_78;
  String local_70;
  _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
  local_60;
  
  *this = (TypedTestCasePState)0x1;
  pcVar8 = registered_tests + -1;
  local_88 = this;
  local_7c = line;
  local_78 = file;
  do {
    pcVar7 = pcVar8 + 1;
    pcVar8 = pcVar8 + 1;
    iVar3 = isspace((int)*pcVar7);
  } while (iVar3 != 0);
  Message::Message(&local_a0);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = (_Rb_tree_node_base *)(local_88 + 0x10);
  pcVar7 = pcVar8;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (pcVar7 == (char *)0x0) {
      for (p_Var6 = *(_Rb_tree_node_base **)(local_88 + 0x20); p_Var6 != p_Var1;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        String::String(&local_98,*(char **)(p_Var6 + 1));
        sVar4 = std::
                set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                ::count((set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                         *)&local_60,&local_98);
        String::~String(&local_98);
        if (sVar4 == 0) {
          pMVar5 = Message::operator<<(&local_a0,(char (*) [25])"You forgot to list test ");
          pMVar5 = Message::operator<<(pMVar5,(char **)(p_Var6 + 1));
          Message::operator<<(pMVar5,(char (*) [3])0x1701e7);
        }
      }
      StrStreamToString((internal *)&local_98,local_a0.ss_);
      bVar2 = String::operator!=(&local_98,"");
      __stream = _stderr;
      if (!bVar2) {
        String::~String(&local_98);
        std::
        _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
        ::~_Rb_tree(&local_60);
        if (local_a0.ss_ != (StrStream *)0x0) {
          (**(code **)(*(long *)local_a0.ss_ + 8))();
        }
        return pcVar8;
      }
      FormatFileLocation((internal *)&local_70,local_78,local_7c);
      fprintf(__stream,"%s %s",local_70.c_str_,local_98.c_str_);
      String::~String(&local_70);
      fflush(_stderr);
      abort();
    }
    GetPrefixUntilComma((internal *)&local_98,pcVar7);
    sVar4 = std::
            set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
            ::count((set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                     *)&local_60,&local_98);
    if (sVar4 == 0) {
      for (p_Var6 = *(_Rb_tree_node_base **)(local_88 + 0x20); p_Var6 != p_Var1;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        bVar2 = String::operator==(&local_98,*(char **)(p_Var6 + 1));
        if (bVar2) {
          std::
          _Rb_tree<testing::internal::String,testing::internal::String,std::_Identity<testing::internal::String>,std::less<testing::internal::String>,std::allocator<testing::internal::String>>
          ::_M_insert_unique<testing::internal::String_const&>
                    ((_Rb_tree<testing::internal::String,testing::internal::String,std::_Identity<testing::internal::String>,std::less<testing::internal::String>,std::allocator<testing::internal::String>>
                      *)&local_60,&local_98);
          goto LAB_0015549b;
        }
      }
      pMVar5 = Message::operator<<(&local_a0,(char (*) [15])"No test named ");
      pMVar5 = Message::operator<<(pMVar5,&local_98);
      Message::operator<<(pMVar5,(char (*) [34])" can be found in this test case.\n");
    }
    else {
      pMVar5 = Message::operator<<(&local_a0,(char (*) [6])"Test ");
      pMVar5 = Message::operator<<(pMVar5,&local_98);
      Message::operator<<(pMVar5,(char (*) [28])" is listed more than once.\n");
    }
LAB_0015549b:
    String::~String(&local_98);
    pcVar7 = SkipComma(pcVar7);
  } while( true );
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef ::std::set<const char*>::const_iterator DefinedTestIter;
  registered_ = true;

  // Skip initial whitespace in registered_tests since some
  // preprocessors prefix stringizied literals with whitespace.
  registered_tests = SkipSpaces(registered_tests);

  Message errors;
  ::std::set<String> tests;
  for (const char* names = registered_tests; names != NULL;
       names = SkipComma(names)) {
    const String name = GetPrefixUntilComma(names);
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (DefinedTestIter it = defined_test_names_.begin();
         it != defined_test_names_.end();
         ++it) {
      if (name == *it) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (DefinedTestIter it = defined_test_names_.begin();
       it != defined_test_names_.end();
       ++it) {
    if (tests.count(*it) == 0) {
      errors << "You forgot to list test " << *it << ".\n";
    }
  }

  const String& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}